

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::SetConfigDirCacheVariable(cmFindPackageCommand *this,string *value)

{
  cmMakefile *pcVar1;
  string_view value_00;
  undefined8 value_01;
  bool bVar2;
  PolicyStatus PVar3;
  char *doc;
  char local_99;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string help;
  string *value_local;
  cmFindPackageCommand *this_local;
  
  help.field_2._8_8_ = value;
  cmAlphaNum::cmAlphaNum(&local_68,"The directory containing a CMake configuration file for ");
  cmAlphaNum::cmAlphaNum(&local_98,&this->Name);
  local_99 = '.';
  cmStrCat<char>((string *)local_38,&local_68,&local_98,&local_99);
  value_01 = help.field_2._8_8_;
  pcVar1 = (this->super_cmFindCommon).Makefile;
  doc = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition(pcVar1,&this->Variable,(string *)value_01,doc,PATH,true);
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  if ((PVar3 == NEW) &&
     (bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,&this->Variable)
     , bVar2)) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    value_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)help.field_2._8_8_);
    cmMakefile::AddDefinition(pcVar1,&this->Variable,value_00);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFindPackageCommand::SetConfigDirCacheVariable(const std::string& value)
{
  std::string const help =
    cmStrCat("The directory containing a CMake configuration file for ",
             this->Name, '.');
  this->Makefile->AddCacheDefinition(this->Variable, value, help.c_str(),
                                     cmStateEnums::PATH, true);
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW &&
      this->Makefile->IsNormalDefinitionSet(this->Variable)) {
    this->Makefile->AddDefinition(this->Variable, value);
  }
}